

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_filter.cpp
# Opt level: O2

void __thiscall
duckdb::StatisticsPropagator::UpdateFilterStatistics
          (StatisticsPropagator *this,BaseStatistics *lstats,BaseStatistics *rstats,
          ExpressionType comparison_type)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000009;
  Value local_a0;
  Value local_60;
  
  iVar2 = (int)CONCAT71(in_register_00000009,comparison_type);
  if ((iVar2 != 0x25) && (iVar2 != 0x28)) {
    BaseStatistics::Set(lstats,CANNOT_HAVE_NULL_VALUES);
    BaseStatistics::Set(rstats,CANNOT_HAVE_NULL_VALUES);
  }
  bVar1 = LogicalType::IsNumeric(&lstats->type);
  if (((bVar1) && (bVar1 = NumericStats::HasMinMax(lstats), bVar1)) &&
     (bVar1 = NumericStats::HasMinMax(rstats), bVar1)) {
    switch(comparison_type) {
    case COMPARE_NOTEQUAL:
      goto switchD_01a7b2a9_caseD_1a;
    case COMPARE_LESSTHAN:
    case COMPARE_LESSTHANOREQUALTO:
      NumericStats::Max(&local_a0,lstats);
      NumericStats::Max(&local_60,rstats);
      bVar1 = Value::operator>(&local_a0,&local_60);
      Value::~Value(&local_60);
      Value::~Value(&local_a0);
      if (bVar1) {
        NumericStats::Max(&local_a0,rstats);
        NumericStats::SetMax(lstats,&local_a0);
        Value::~Value(&local_a0);
      }
      NumericStats::Min(&local_a0,rstats);
      NumericStats::Min(&local_60,lstats);
      bVar1 = Value::operator<(&local_a0,&local_60);
      Value::~Value(&local_60);
      Value::~Value(&local_a0);
      if (!bVar1) {
        return;
      }
      NumericStats::Min(&local_a0,lstats);
      NumericStats::SetMin(rstats,&local_a0);
      break;
    case COMPARE_GREATERTHAN:
    case COMPARE_GREATERTHANOREQUALTO:
      NumericStats::Max(&local_a0,rstats);
      NumericStats::Max(&local_60,lstats);
      bVar1 = Value::operator>(&local_a0,&local_60);
      Value::~Value(&local_60);
      Value::~Value(&local_a0);
      if (bVar1) {
        NumericStats::Max(&local_a0,lstats);
        NumericStats::SetMax(rstats,&local_a0);
        Value::~Value(&local_a0);
      }
      NumericStats::Min(&local_a0,lstats);
      NumericStats::Min(&local_60,rstats);
      bVar1 = Value::operator<(&local_a0,&local_60);
      Value::~Value(&local_60);
      Value::~Value(&local_a0);
      if (!bVar1) {
        return;
      }
      NumericStats::Min(&local_a0,rstats);
      NumericStats::SetMin(lstats,&local_a0);
      break;
    default:
      if (comparison_type != COMPARE_BOUNDARY_END) {
        return;
      }
    case COMPARE_BOUNDARY_START:
      NumericStats::Min(&local_a0,lstats);
      NumericStats::Min(&local_60,rstats);
      bVar1 = Value::operator>(&local_a0,&local_60);
      Value::~Value(&local_60);
      Value::~Value(&local_a0);
      if (bVar1) {
        NumericStats::Min(&local_a0,lstats);
        NumericStats::SetMin(rstats,&local_a0);
      }
      else {
        NumericStats::Min(&local_a0,rstats);
        NumericStats::SetMin(lstats,&local_a0);
      }
      Value::~Value(&local_a0);
      NumericStats::Max(&local_a0,lstats);
      NumericStats::Max(&local_60,rstats);
      bVar1 = Value::operator<(&local_a0,&local_60);
      Value::~Value(&local_60);
      Value::~Value(&local_a0);
      if (bVar1) {
        NumericStats::Max(&local_a0,lstats);
        NumericStats::SetMax(rstats,&local_a0);
      }
      else {
        NumericStats::Max(&local_a0,rstats);
        NumericStats::SetMax(lstats,&local_a0);
      }
    }
    Value::~Value(&local_a0);
  }
switchD_01a7b2a9_caseD_1a:
  return;
}

Assistant:

void StatisticsPropagator::UpdateFilterStatistics(BaseStatistics &lstats, BaseStatistics &rstats,
                                                  ExpressionType comparison_type) {
	// regular comparisons removes all null values
	if (!IsCompareDistinct(comparison_type)) {
		lstats.Set(StatsInfo::CANNOT_HAVE_NULL_VALUES);
		rstats.Set(StatsInfo::CANNOT_HAVE_NULL_VALUES);
	}
	D_ASSERT(lstats.GetType() == rstats.GetType());
	if (!lstats.GetType().IsNumeric()) {
		// don't handle non-numeric columns here (yet)
		return;
	}
	if (!NumericStats::HasMinMax(lstats) || !NumericStats::HasMinMax(rstats)) {
		// no stats available: skip this
		return;
	}
	switch (comparison_type) {
	case ExpressionType::COMPARE_LESSTHAN:
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		// LEFT < RIGHT OR LEFT <= RIGHT
		// we know that every value of left is smaller (or equal to) every value in right
		// i.e. if we have left = [-50, 250] and right = [-100, 100]

		// we know that left.max is AT MOST equal to right.max
		// because any value in left that is BIGGER than right.max will not pass the filter
		if (NumericStats::Max(lstats) > NumericStats::Max(rstats)) {
			NumericStats::SetMax(lstats, NumericStats::Max(rstats));
		}

		// we also know that right.min is AT MOST equal to left.min
		// because any value in right that is SMALLER than left.min will not pass the filter
		if (NumericStats::Min(rstats) < NumericStats::Min(lstats)) {
			NumericStats::SetMin(rstats, NumericStats::Min(lstats));
		}
		// so in our example, the bounds get updated as follows:
		// left: [-50, 100], right: [-50, 100]
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		// LEFT > RIGHT OR LEFT >= RIGHT
		// we know that every value of left is bigger (or equal to) every value in right
		// this is essentially the inverse of the less than (or equal to) scenario
		if (NumericStats::Max(rstats) > NumericStats::Max(lstats)) {
			NumericStats::SetMax(rstats, NumericStats::Max(lstats));
		}
		if (NumericStats::Min(lstats) < NumericStats::Min(rstats)) {
			NumericStats::SetMin(lstats, NumericStats::Min(rstats));
		}
		break;
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		// LEFT = RIGHT
		// only the tightest bounds pass
		// so if we have e.g. left = [-50, 250] and right = [-100, 100]
		// the tighest bounds are [-50, 100]
		// select the highest min
		if (NumericStats::Min(lstats) > NumericStats::Min(rstats)) {
			NumericStats::SetMin(rstats, NumericStats::Min(lstats));
		} else {
			NumericStats::SetMin(lstats, NumericStats::Min(rstats));
		}
		// select the lowest max
		if (NumericStats::Max(lstats) < NumericStats::Max(rstats)) {
			NumericStats::SetMax(rstats, NumericStats::Max(lstats));
		} else {
			NumericStats::SetMax(lstats, NumericStats::Max(rstats));
		}
		break;
	default:
		break;
	}
}